

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void rw::decompressDXT5(uint8 *adst,int32 w,int32 h,uint8 *src)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint local_dc;
  uint local_d8;
  uint32 k_2;
  uint32 l;
  int32 k_1;
  uint64 alphas;
  uint local_c0;
  int32 k;
  uint32 indices;
  uint32 col1;
  uint32 col0;
  int32 j;
  uint8 (*dst) [4];
  uint8 aidx [16];
  uint8 idx [16];
  uint32 a [8];
  uint32 c [4] [4];
  int32 y;
  int32 x;
  uint8 *src_local;
  int32 h_local;
  int32 w_local;
  uint8 *adst_local;
  
  c[3][3] = 0;
  c[3][2] = 0;
  for (col1 = 0; (int)col1 < w * h; col1 = col1 + 0x10) {
    uVar1 = *(ushort *)(src + (int)(col1 + 8));
    uVar2 = *(ushort *)(src + (int)(col1 + 10));
    a[6] = ((uint)(uVar1 >> 0xb) * 0xff) / 0x1f;
    a[7] = ((uVar1 >> 5 & 0x3f) * 0xff) / 0x3f;
    c[0][0] = ((uVar1 & 0x1f) * 0xff) / 0x1f;
    c[0][2] = ((uint)(uVar2 >> 0xb) * 0xff) / 0x1f;
    c[0][3] = ((uVar2 >> 5 & 0x3f) * 0xff) / 0x3f;
    c[1][0] = ((uVar2 & 0x1f) * 0xff) / 0x1f;
    if ((uint)uVar2 < (uint)uVar1) {
      c[1][2] = (a[6] * 2 + c[0][2]) / 3;
      c[1][3] = (a[7] * 2 + c[0][3]) / 3;
      c[2][0] = (c[0][0] * 2 + c[1][0]) / 3;
      c[2][2] = (a[6] + c[0][2] * 2) / 3;
      c[2][3] = (a[7] + c[0][3] * 2) / 3;
      c[3][0] = (c[0][0] + c[1][0] * 2) / 3;
    }
    else {
      c[1][2] = a[6] + c[0][2] >> 1;
      c[1][3] = a[7] + c[0][3] >> 1;
      c[2][0] = c[0][0] + c[1][0] >> 1;
      c[2][2] = 0;
      c[2][3] = 0;
      c[3][0] = 0;
    }
    uVar3 = (uint)src[(int)col1];
    uVar4 = (uint)src[(int)(col1 + 1)];
    if (uVar4 < uVar3) {
      a[0] = (uVar3 * 6 + uVar4) / 7;
      a[1] = (uVar3 * 5 + uVar4 * 2) / 7;
      a[2] = (uVar3 * 4 + uVar4 * 3) / 7;
      a[3] = (uVar3 * 3 + uVar4 * 4) / 7;
      a[4] = (uVar3 * 2 + uVar4 * 5) / 7;
      a[5] = (uVar3 + uVar4 * 6) / 7;
    }
    else {
      a[0] = (uVar3 * 4 + uVar4) / 5;
      a[1] = (uVar3 * 3 + uVar4 * 2) / 5;
      a[2] = (uVar3 * 2 + uVar4 * 3) / 5;
      a[3] = (uVar3 + uVar4 * 4) / 5;
      a[4] = 0;
      a[5] = 0xff;
    }
    local_c0 = *(uint *)(src + (int)(col1 + 0xc));
    for (alphas._4_4_ = 0; alphas._4_4_ < 0x10; alphas._4_4_ = alphas._4_4_ + 1) {
      aidx[(long)alphas._4_4_ + 8] = (byte)local_c0 & 3;
      local_c0 = local_c0 >> 2;
    }
    _l = *(ulong *)(src + (int)(col1 + 2));
    for (k_2 = 0; (int)k_2 < 0x10; k_2 = k_2 + 1) {
      aidx[(long)(int)k_2 + -8] = (byte)_l & 7;
      _l = _l >> 3;
    }
    for (local_d8 = 0; local_d8 < 4; local_d8 = local_d8 + 1) {
      for (local_dc = 0; local_dc < 4; local_dc = local_dc + 1) {
        adst[(ulong)((c[3][2] + local_d8) * w + c[3][3] + local_dc) * 4] =
             (uint8)c[(ulong)aidx[(ulong)(local_d8 * 4 + local_dc) + 8] - 1][2];
        adst[(ulong)((c[3][2] + local_d8) * w + c[3][3] + local_dc) * 4 + 1] =
             (uint8)c[(ulong)aidx[(ulong)(local_d8 * 4 + local_dc) + 8] - 1][3];
        adst[(ulong)((c[3][2] + local_d8) * w + c[3][3] + local_dc) * 4 + 2] =
             (uint8)c[aidx[(ulong)(local_d8 * 4 + local_dc) + 8]][0];
        adst[(ulong)((c[3][2] + local_d8) * w + c[3][3] + local_dc) * 4 + 3] =
             (uint8)a[(ulong)aidx[(ulong)(local_d8 * 4 + local_dc) - 8] - 2];
      }
    }
    c[3][3] = c[3][3] + 4;
    if (w <= (int)c[3][3]) {
      c[3][2] = c[3][2] + 4;
      c[3][3] = 0;
    }
  }
  return;
}

Assistant:

void
decompressDXT5(uint8 *adst, int32 w, int32 h, uint8 *src)
{
	/* j loops through old texels
	 * x and y loop through new texels */
	int32 x = 0, y = 0;
	uint32 c[4][4];
	uint32 a[8];
	uint8 idx[16];
	uint8 aidx[16];
	uint8 (*dst)[4] = (uint8(*)[4])adst;
	for(int32 j = 0; j < w*h; j += 16){
		/* calculate colors */
		uint32 col0 = *((uint16*)&src[j+8]);
		uint32 col1 = *((uint16*)&src[j+10]);
		c[0][0] = ((col0>>11) & 0x1F)*0xFF/0x1F;
		c[0][1] = ((col0>> 5) & 0x3F)*0xFF/0x3F;
		c[0][2] = ( col0      & 0x1F)*0xFF/0x1F;

		c[1][0] = ((col1>>11) & 0x1F)*0xFF/0x1F;
		c[1][1] = ((col1>> 5) & 0x3F)*0xFF/0x3F;
		c[1][2] = ( col1      & 0x1F)*0xFF/0x1F;
		if(col0 > col1){
			c[2][0] = (2*c[0][0] + 1*c[1][0])/3;
			c[2][1] = (2*c[0][1] + 1*c[1][1])/3;
			c[2][2] = (2*c[0][2] + 1*c[1][2])/3;

			c[3][0] = (1*c[0][0] + 2*c[1][0])/3;
			c[3][1] = (1*c[0][1] + 2*c[1][1])/3;
			c[3][2] = (1*c[0][2] + 2*c[1][2])/3;
		}else{
			c[2][0] = (c[0][0] + c[1][0])/2;
			c[2][1] = (c[0][1] + c[1][1])/2;
			c[2][2] = (c[0][2] + c[1][2])/2;

			c[3][0] = 0x00;
			c[3][1] = 0x00;
			c[3][2] = 0x00;
		}

		a[0] = src[j+0];
		a[1] = src[j+1];
		if(a[0] > a[1]){
			a[2] = (6*a[0] + 1*a[1])/7;
			a[3] = (5*a[0] + 2*a[1])/7;
			a[4] = (4*a[0] + 3*a[1])/7;
			a[5] = (3*a[0] + 4*a[1])/7;
			a[6] = (2*a[0] + 5*a[1])/7;
			a[7] = (1*a[0] + 6*a[1])/7;
		}else{
			a[2] = (4*a[0] + 1*a[1])/5;
			a[3] = (3*a[0] + 2*a[1])/5;
			a[4] = (2*a[0] + 3*a[1])/5;
			a[5] = (1*a[0] + 4*a[1])/5;
			a[6] = 0;
			a[7] = 0xFF;
		}

		/* make index list */
		uint32 indices = *((uint32*)&src[j+12]);
		for(int32 k = 0; k < 16; k++){
			idx[k] = indices & 0x3;
			indices >>= 2;
		}
		// only 6 indices
		uint64 alphas = *((uint64*)&src[j+2]);
		for(int32 k = 0; k < 16; k++){
			aidx[k] = alphas & 0x7;
			alphas >>= 3;
		}

		/* write bytes */
		for(uint32 l = 0; l < 4; l++)
			for(uint32 k = 0; k < 4; k++){
				dst[(y+l)*w + x+k][0] = c[idx[l*4+k]][0];
				dst[(y+l)*w + x+k][1] = c[idx[l*4+k]][1];
				dst[(y+l)*w + x+k][2] = c[idx[l*4+k]][2];
				dst[(y+l)*w + x+k][3] = a[aidx[l*4+k]];
			}
		x += 4;
		if(x >= w){
			y += 4;
			x = 0;
		}
	}
}